

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

double cs_time(void)

{
  int iVar1;
  undefined1 local_28 [8];
  timeval tv;
  double now;
  
  iVar1 = gettimeofday((timeval *)local_28,(__timezone_ptr_t)0x0);
  if (iVar1 == 0) {
    now = (double)(long)local_28 + (double)tv.tv_sec / 1000000.0;
  }
  else {
    now = 0.0;
  }
  return now;
}

Assistant:

double cs_time() {
    double now;
#ifndef _WIN32
    struct timeval tv;
    if (gettimeofday(&tv, NULL /* tz */) != 0) return 0;
    now = (double) tv.tv_sec + (((double) tv.tv_usec) / 1000000.0);
#else
    now = GetTickCount() / 1000.0;
#endif
    return now;
}